

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

void __thiscall duckdb_shell::ShellState::ShowConfiguration(ShellState *this)

{
  uint *puVar1;
  char *pcVar2;
  char *pcVar3;
  uint *puVar4;
  
  pcVar3 = "on";
  pcVar2 = "on";
  if ((this->shellFlgs & 0x40) == 0) {
    pcVar2 = "off";
  }
  fprintf((FILE *)this->out,"%12.12s: %s\n","echo",pcVar2);
  if (this->showHeader == false) {
    pcVar3 = "off";
  }
  fprintf((FILE *)this->out,"%12.12s: %s\n","headers",pcVar3);
  fprintf((FILE *)this->out,"%12.12s: %s\n","mode",modeDescr[(int)this->mode]);
  fprintf((FILE *)this->out,"%12.12s: ","nullvalue");
  OutputCString(this,(this->nullValue)._M_dataplus._M_p);
  fputc(10,(FILE *)this->out);
  if ((this->outfile)._M_string_length == 0) {
    pcVar2 = "stdout";
  }
  else {
    pcVar2 = (this->outfile)._M_dataplus._M_p;
  }
  fprintf((FILE *)this->out,"%12.12s: %s\n","output",pcVar2);
  fprintf((FILE *)this->out,"%12.12s: ","colseparator");
  OutputCString(this,(this->colSeparator)._M_dataplus._M_p);
  fputc(10,(FILE *)this->out);
  fprintf((FILE *)this->out,"%12.12s: ","rowseparator");
  OutputCString(this,(this->rowSeparator)._M_dataplus._M_p);
  fputc(10,(FILE *)this->out);
  fprintf((FILE *)this->out,"%12.12s: ","width");
  puVar1 = (uint *)(this->colWidth).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar4 = (uint *)(this->colWidth).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    fprintf((FILE *)this->out,"%d ",(ulong)*puVar4);
  }
  fputc(10,(FILE *)this->out);
  fprintf((FILE *)this->out,"%12.12s: %s\n","filename",(this->zDbFilename)._M_dataplus._M_p);
  return;
}

Assistant:

void ShellState::ShowConfiguration() {
	utf8_printf(out, "%12.12s: %s\n", "echo", ShellHasFlag(SHFLG_Echo) ? "on" : "off");
	utf8_printf(out, "%12.12s: %s\n", "headers", showHeader ? "on" : "off");
	utf8_printf(out, "%12.12s: %s\n", "mode", modeDescr[int(mode)]);
	utf8_printf(out, "%12.12s: ", "nullvalue");
	OutputCString(nullValue.c_str());
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: %s\n", "output", !outfile.empty() ? outfile.c_str() : "stdout");
	utf8_printf(out, "%12.12s: ", "colseparator");
	OutputCString(colSeparator.c_str());
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: ", "rowseparator");
	OutputCString(rowSeparator.c_str());
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: ", "width");
	for (auto w : colWidth) {
		raw_printf(out, "%d ", w);
	}
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: %s\n", "filename", zDbFilename.c_str());
}